

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapeQuad> *copy)

{
  long local_38;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01733048;
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,&PTR_PTR_0172f518,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeQuad>);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_0172f140;
  TPZManVector<int,_4>::TPZManVector(&this->fSideOrient,&copy->fSideOrient);
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  local_38 = -1;
  TPZManVector<long,_5>::TPZManVector(&this->fConnectIndexes,5,&local_38);
  this->fhdivfam = copy->fhdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
       super_TPZInterpolationSpace.fPreferredOrder;
  TPZManVector<long,_5>::operator=(&this->fConnectIndexes,&copy->fConnectIndexes);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, const TPZCompElHDiv<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
    this->fConnectIndexes = copy.fConnectIndexes;
}